

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int Curl_num_addresses(Curl_addrinfo *addr)

{
  int iVar1;
  
  iVar1 = 0;
  for (; addr != (Curl_addrinfo *)0x0; addr = addr->ai_next) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int Curl_num_addresses(const Curl_addrinfo *addr)
{
  int i = 0;
  while(addr) {
    addr = addr->ai_next;
    i++;
  }
  return i;
}